

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int CollectionStore(unqlite_col *pCol,jx9_value *pValue)

{
  uint uVar1;
  unqlite_vm *puVar2;
  unqlite *pDb;
  unqlite_kv_engine *puVar3;
  unqlite_kv_methods *puVar4;
  void *pvVar5;
  sxi32 sVar6;
  long iTotal;
  long iRec;
  anon_union_8_3_18420de5_for_x local_70;
  undefined8 local_68;
  jx9_vm *pjStack_60;
  jx9_vm *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar2 = pCol->pVm;
  pDb = puVar2->pDb;
  if (pCol->nTotRec == 0x7fffffffffffffff) {
    unqliteGenErrorFormat(pDb,"Collection \'%z\': Records limit reached",&pCol->sName);
    sVar6 = -7;
  }
  else {
    puVar3 = ((pDb->sDB).pPager)->pEngine;
    puVar4 = puVar3->pIo->pMethods;
    if (puVar4->xReplace ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      unqliteGenErrorFormat
                (pDb,
                 "Cannot store record into collection \'%z\' due to a read-only Key/Value storage engine"
                 ,&pCol->sName);
      sVar6 = -0x4b;
    }
    else {
      (pCol->sWorker).nByte = 0;
      uVar1 = (pCol->sWorker).nFlags;
      if ((uVar1 & 4) != 0) {
        (pCol->sWorker).pBlob = (void *)0x0;
        (pCol->sWorker).mByte = 0;
        (pCol->sWorker).nFlags = uVar1 & 0xfffffffb;
      }
      if (((pValue->iFlags & 0x40) != 0) && ((*(byte *)((pValue->x).iVal + 0x40) & 1) != 0)) {
        pjStack_60 = puVar2->pJx9Vm;
        local_70 = (anon_union_8_3_18420de5_for_x)pCol->nLastid;
        uStack_40 = 0;
        local_38 = 0;
        uStack_50 = 0;
        local_48 = 0;
        local_68 = 2;
        local_58 = pjStack_60;
        jx9_array_add_strkey_elem(pValue,"__id",(jx9_value *)&local_70);
        jx9MemObjRelease((jx9_value *)&local_70);
      }
      SyBlobFormat(&pCol->sWorker,"%z_%qd",&pCol->sName,pCol->nLastid);
      uVar1 = (pCol->sWorker).nByte;
      if ((ulong)uVar1 == 0) {
        unqliteGenError(pCol->pVm->pDb,"unQLite is running out of memory");
        sVar6 = -1;
      }
      else {
        sVar6 = FastJsonEncode(pValue,&pCol->sWorker,0);
        if (sVar6 == 0) {
          pvVar5 = (pCol->sWorker).pBlob;
          sVar6 = (*puVar4->xReplace)(puVar3,pvVar5,uVar1,(void *)((ulong)uVar1 + (long)pvVar5),
                                      (ulong)((pCol->sWorker).nByte - uVar1));
          if (sVar6 == 0) {
            CollectionCacheInstallRecord(pCol,pCol->nLastid,pValue);
            iRec = pCol->nLastid + 1;
            pCol->nLastid = iRec;
            iTotal = pCol->nTotRec + 1;
            pCol->nTotRec = iTotal;
            sVar6 = CollectionSetHeader((unqlite_kv_engine *)0x0,pCol,iRec,iTotal,(jx9_value *)0x0);
            if (sVar6 == 0) {
              return 0;
            }
          }
          unqliteGenErrorFormat
                    (pCol->pVm->pDb,"IO error while storing record into collection \'%z\'",
                     &pCol->sName);
        }
      }
    }
  }
  return sVar6;
}

Assistant:

static int CollectionStore(
	unqlite_col *pCol, /* Target collection */
	jx9_value *pValue  /* JSON value to be stored */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	sxu32 nKeyLen;
	int rc;	
	/* Point to the underlying KV store */
	pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	pMethods = pEngine->pIo->pMethods;
	if( pCol->nTotRec >= SXI64_HIGH ){
		/* Collection limit reached. No more records */
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Collection '%z': Records limit reached",
				&pCol->sName
			);
		return UNQLITE_LIMIT;
	}
	if( pMethods->xReplace == 0 ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot store record into collection '%z' due to a read-only Key/Value storage engine",
				&pCol->sName
			);
		return UNQLITE_READ_ONLY;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	if( jx9_value_is_json_object(pValue) ){
		jx9_value sId;
		/* If the given type is a JSON object, then add the special __id field */
		jx9MemObjInitFromInt(pCol->pVm->pJx9Vm,&sId,pCol->nLastid);
		jx9_array_add_strkey_elem(pValue,"__id",&sId);
		jx9MemObjRelease(&sId);
	}
	/* Prepare the unique ID for this record */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,pCol->nLastid);
	nKeyLen = SyBlobLength(pWorker);
	if( nKeyLen < 1 ){
		unqliteGenOutofMem(pCol->pVm->pDb);
		return UNQLITE_NOMEM;
	}
	/* Turn to FastJson */
	rc = FastJsonEncode(pValue,pWorker,0);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Finally perform the insertion */
	rc = pMethods->xReplace(
		pEngine,
		SyBlobData(pWorker),nKeyLen,
		SyBlobDataAt(pWorker,nKeyLen),SyBlobLength(pWorker)-nKeyLen
		);
	if( rc == UNQLITE_OK ){
		/* Save the value in the cache */
		CollectionCacheInstallRecord(pCol,pCol->nLastid,pValue);
		/* Increment the unique __id */
		pCol->nLastid++;
		pCol->nTotRec++;
		/* Reflect the change */
		rc = CollectionSetHeader(0,pCol,pCol->nLastid,pCol->nTotRec,0);
	}
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
				"IO error while storing record into collection '%z'",
				&pCol->sName
			);
		return rc;
	}
	return UNQLITE_OK;
}